

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O0

void DFS_classify(Graph *g,GraphNode *n,classifier_state *state)

{
  GraphNode *n_00;
  GraphNodeLink *pGVar1;
  GraphNode *S;
  GraphNodeLink *E;
  uint i;
  classifier_state *state_local;
  GraphNode *n_local;
  Graph *g_local;
  
  if (n == (GraphNode *)0x0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/graph.c"
                  ,0x138,"void DFS_classify(Graph *, GraphNode *, struct classifier_state *)");
  }
  n->pre = state->preorder;
  state->preorder = state->preorder + 1;
  for (E._4_4_ = 0; E._4_4_ < (*(uint *)&n->succs & 0xffff); E._4_4_ = E._4_4_ + 1) {
    pGVar1 = (n->succs).links + E._4_4_;
    n_00 = g->nodes[pGVar1->node_index];
    if (n_00->pre == 0) {
      pGVar1->edge_type = '\x01';
      DFS_classify(g,n_00,state);
    }
    else if (n_00->rpost == 0) {
      pGVar1->edge_type = '\x02';
    }
    else if (n->pre < n_00->pre) {
      pGVar1->edge_type = '\x04';
    }
    else {
      pGVar1->edge_type = '\b';
    }
  }
  n->rpost = state->rpostorder;
  state->rpostorder = state->rpostorder - 1;
  return;
}

Assistant:

static void DFS_classify(Graph *g, GraphNode *n, struct classifier_state *state)
{
	assert(n);

	n->pre = state->preorder;
	state->preorder++;

	/* For each successor node */
	for (unsigned i = 0; i < n->succs.count; i++) {
		struct GraphNodeLink *E = &n->succs.links[i];
		GraphNode *S = g->nodes[E->node_index];
		if (S->pre == 0) {
			E->edge_type = EDGE_TYPE_TREE;
			DFS_classify(g, S, state);
		} else if (S->rpost == 0) {
			E->edge_type = EDGE_TYPE_BACKWARD;
		} else if (n->pre < S->pre) {
			E->edge_type = EDGE_TYPE_FORWARD;
		} else {
			E->edge_type = EDGE_TYPE_CROSS;
		}
	}

	n->rpost = state->rpostorder;
	state->rpostorder--;
}